

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

h2o_hostconf_t *
find_hostconf(h2o_hostconf_t **hostconfs,h2o_iovec_t authority,uint16_t default_port)

{
  h2o_hostconf_t **pphVar1;
  size_t target_len;
  long lVar2;
  h2o_hostconf_t *phVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *__s2;
  undefined8 uStack_70;
  undefined1 auStack_68 [16];
  size_t cmplen;
  h2o_hostconf_t *hostconf;
  char *hostname_lc;
  undefined1 auStack_40 [6];
  uint16_t port;
  h2o_iovec_t hostname;
  h2o_hostconf_t **pphStack_28;
  uint16_t default_port_local;
  h2o_hostconf_t **hostconfs_local;
  h2o_iovec_t authority_local;
  
  if (authority.len < 0x10000) {
    uStack_70 = 0x16ac47;
    hostname.len._6_2_ = default_port;
    pcVar5 = h2o_url_parse_hostport
                       (authority.base,authority.len,(h2o_iovec_t *)auStack_40,
                        (uint16_t *)((long)&hostname_lc + 6));
    pcVar6 = hostname.base;
    if (pcVar5 != (char *)0x0) {
      if (hostname_lc._6_2_ == 0xffff) {
        hostname_lc._6_2_ = hostname.len._6_2_;
      }
      lVar2 = -((ulong)(hostname.base + 0xf) & 0xfffffffffffffff0);
      hostconf = (h2o_hostconf_t *)(auStack_68 + lVar2);
      *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x16ac97;
      memcpy((h2o_hostconf_t *)(auStack_68 + lVar2),_auStack_40,(size_t)pcVar6);
      pcVar6 = hostname.base;
      phVar3 = hostconf;
      *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x16aca4;
      h2o_strtolower((char *)phVar3,(size_t)pcVar6);
      pphStack_28 = hostconfs;
      do {
        pcVar6 = hostname.base;
        phVar3 = hostconf;
        cmplen = (size_t)*pphStack_28;
        if (((((h2o_hostconf_t *)cmplen)->authority).port == hostname_lc._6_2_) ||
           (((((h2o_hostconf_t *)cmplen)->authority).port == 0xffff &&
            (hostname_lc._6_2_ == hostname.len._6_2_)))) {
          if (*(((h2o_hostconf_t *)cmplen)->authority).host.base == '*') {
            pcVar6 = (char *)((((h2o_hostconf_t *)cmplen)->authority).host.len - 1);
            auStack_68._8_8_ = pcVar6;
            if (pcVar6 < hostname.base) {
              pcVar5 = (((h2o_hostconf_t *)cmplen)->authority).host.base;
              __s2 = hostname.base + ((long)&hostconf->global - (long)pcVar6);
              *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x16ad32;
              iVar4 = memcmp(pcVar5 + 1,__s2,(size_t)pcVar6);
              if (iVar4 == 0) {
                return (h2o_hostconf_t *)cmplen;
              }
            }
          }
          else {
            pcVar5 = (((h2o_hostconf_t *)cmplen)->authority).host.base;
            target_len = (((h2o_hostconf_t *)cmplen)->authority).host.len;
            *(undefined8 *)(auStack_68 + lVar2 + -8) = 0x16ad60;
            iVar4 = h2o_memis(pcVar5,target_len,phVar3,(size_t)pcVar6);
            if (iVar4 != 0) {
              return (h2o_hostconf_t *)cmplen;
            }
          }
        }
        pphVar1 = pphStack_28 + 1;
        pphStack_28 = pphStack_28 + 1;
      } while (*pphVar1 != (h2o_hostconf_t *)0x0);
    }
  }
  return (h2o_hostconf_t *)0x0;
}

Assistant:

static h2o_hostconf_t *find_hostconf(h2o_hostconf_t **hostconfs, h2o_iovec_t authority, uint16_t default_port)
{
    h2o_iovec_t hostname;
    uint16_t port;
    char *hostname_lc;

    /* safe-guard for alloca */
    if (authority.len >= 65536)
        return NULL;

    /* extract the specified hostname and port */
    if (h2o_url_parse_hostport(authority.base, authority.len, &hostname, &port) == NULL)
        return NULL;
    if (port == 65535)
        port = default_port;

    /* convert supplied hostname to lower-case */
    hostname_lc = alloca(hostname.len);
    memcpy(hostname_lc, hostname.base, hostname.len);
    h2o_strtolower(hostname_lc, hostname.len);

    do {
        h2o_hostconf_t *hostconf = *hostconfs;
        if (hostconf->authority.port == port || (hostconf->authority.port == 65535 && port == default_port)) {
            if (hostconf->authority.host.base[0] == '*') {
                /* matching against "*.foo.bar" */
                size_t cmplen = hostconf->authority.host.len - 1;
                if (cmplen < hostname.len &&
                    memcmp(hostconf->authority.host.base + 1, hostname_lc + hostname.len - cmplen, cmplen) == 0)
                    return hostconf;
            } else {
                /* exact match */
                if (h2o_memis(hostconf->authority.host.base, hostconf->authority.host.len, hostname_lc, hostname.len))
                    return hostconf;
            }
        }
    } while (*++hostconfs != NULL);

    return NULL;
}